

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_binary.cpp
# Opt level: O0

void __thiscall
flatbuffers::anon_unknown_5::BinaryCodeGenerator::~BinaryCodeGenerator(BinaryCodeGenerator *this)

{
  BinaryCodeGenerator *this_local;
  
  ~BinaryCodeGenerator(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

Status GenerateCode(const Parser &parser, const std::string &path,
                      const std::string &filename) override {
    if (!GenerateBinary(parser, path, filename)) { return Status::ERROR; }
    return Status::OK;
  }